

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.hpp
# Opt level: O1

void __thiscall
njoy::ENDFtk::file::Base<njoy::ENDFtk::file::Type<3>,njoy::ENDFtk::section::Type<3>>::
print<std::back_insert_iterator<std::__cxx11::string>>
          (Base<njoy::ENDFtk::file::Type<3>,njoy::ENDFtk::section::Type<3>> *this,
          back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *it,int MAT)

{
  _Rb_tree_node_base *p_Var1;
  undefined8 *puVar2;
  StructureDivision local_68;
  
  for (p_Var1 = *(_Rb_tree_node_base **)(this + 0x18); p_Var1 != (_Rb_tree_node_base *)(this + 8);
      p_Var1 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var1)) {
    ENDFtk::section::Type<3>::print<std::back_insert_iterator<std::__cxx11::string>>
              ((Type<3> *)&p_Var1[1]._M_parent,it,MAT,3);
  }
  if (MAT < 1) {
    tools::Log::error<char_const*>("Illegal material number (MAT) specified in FEND record");
    tools::Log::info<char_const*>("FEND records require a material number greater than 0");
    tools::Log::info<char_const*,int>("Specified material number: {}",MAT);
    puVar2 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar2 = getenv;
    __cxa_throw(puVar2,&std::exception::typeinfo,std::exception::~exception);
  }
  local_68.base.fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.super__Head_base<1UL,_double,_false>.
  _M_head_impl = 0.0;
  local_68.base.fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Head_base<0UL,_double,_false>._M_head_impl = 0.0;
  local_68.base.fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Head_base<3UL,_long,_false>._M_head_impl = 0;
  local_68.base.fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Head_base<2UL,_long,_false>._M_head_impl = 0
  ;
  local_68.base.fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Tuple_impl<5UL,_long>.super__Head_base<5UL,_long,_false>
  ._M_head_impl = (_Head_base<5UL,_long,_false>)0;
  local_68.base.fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl = 0;
  local_68.tail.fields._M_elems[1] = 0;
  local_68.tail.fields._M_elems[2] = 0;
  local_68.tail.fields._M_elems[0] = MAT;
  StructureDivision::print<std::back_insert_iterator<std::__cxx11::string>>(&local_68,it);
  return;
}

Assistant:

void print( OutputIterator& it, int MAT ) const {

  int MF = this->MF();
  for ( const auto& entry : this->sections_ ) {

    Derived::printSection( entry.second, it, MAT, MF );
  }
  FEND( MAT ).print( it );
}